

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O1

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  ostream *poVar1;
  undefined8 uVar2;
  Message ss;
  bool bVar3;
  char *str;
  char *in_RDX;
  Int32 IVar4;
  undefined1 local_78 [8];
  string env_var;
  Message local_38;
  Int32 local_2c [2];
  Int32 result;
  
  FlagToEnvVar_abi_cxx11_((string *)local_78,(internal *)flag,in_RDX);
  str = getenv((char *)local_78);
  IVar4 = default_value;
  if (str != (char *)0x0) {
    local_2c[0] = default_value;
    Message::Message((Message *)((long)&env_var.field_2 + 8));
    uVar2 = env_var.field_2._8_8_;
    poVar1 = (ostream *)(env_var.field_2._8_8_ + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Environment variable ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,(char *)local_78,(long)env_var._M_dataplus._M_p);
    bVar3 = ParseInt32((Message *)((long)&env_var.field_2 + 8),str,local_2c);
    if (uVar2 != 0) {
      (**(code **)(*(long *)uVar2 + 8))(uVar2);
      env_var.field_2._8_8_ = 0;
    }
    IVar4 = local_2c[0];
    if (!bVar3) {
      Message::Message(&local_38);
      ss.ss_.ptr_ = local_38.ss_.ptr_;
      std::ostream::operator<<((ostream *)((long)local_38.ss_.ptr_ + 0x10),default_value);
      StringStreamToString((string *)((long)&env_var.field_2 + 8),(stringstream *)ss.ss_.ptr_);
      printf("The default value %s is used.\n",env_var.field_2._8_8_);
      if ((undefined1 *)env_var.field_2._8_8_ != &stack0xffffffffffffffb8) {
        operator_delete((void *)env_var.field_2._8_8_);
      }
      if (ss.ss_.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)ss.ss_.ptr_ + 8))(ss.ss_.ptr_);
        local_38.ss_.ptr_ =
             (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
      fflush(_stdout);
      IVar4 = default_value;
    }
  }
  if (local_78 != (undefined1  [8])&env_var._M_string_length) {
    operator_delete((void *)local_78);
  }
  return IVar4;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == NULL) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
}